

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void * generate_func_and_redirect_to_bb_gen(MIR_context_t ctx,MIR_item_t func_item)

{
  MIR_item_t func_item_local;
  MIR_context_t ctx_local;
  
  generate_func_and_redirect(ctx,func_item,0);
  return func_item->addr;
}

Assistant:

static void *generate_func_and_redirect_to_bb_gen (MIR_context_t ctx, MIR_item_t func_item) {
  generate_func_and_redirect (ctx, func_item, FALSE);
  return func_item->addr;
}